

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveAlignFill::Encode(CDirectiveAlignFill *this)

{
  int64_t *__s;
  void *local_b8;
  void *local_a0;
  int64_t n;
  uchar buffer [128];
  CDirectiveAlignFill *this_local;
  
  local_a0 = (void *)this->finalSize;
  __s = &n;
  local_b8 = local_a0;
  if (0x80 < (long)local_a0) {
    local_b8 = (void *)0x80;
  }
  memset(__s,(uint)(byte)this->fillByte,(size_t)local_b8);
  for (; 0x80 < (long)local_a0; local_a0 = (void *)((long)local_a0 + -0x80)) {
    FileManager::write(g_fileManager,(int)&n,(void *)0x80,(size_t)__s);
  }
  FileManager::write(g_fileManager,(int)&n,local_a0,(size_t)__s);
  return;
}

Assistant:

void CDirectiveAlignFill::Encode() const
{
	unsigned char buffer[128];
	int64_t n = finalSize;

	memset(buffer,fillByte,n > 128 ? 128 : n);
	while (n > 128)
	{
		g_fileManager->write(buffer,128);
		n -= 128;
	}

	g_fileManager->write(buffer,n);
}